

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicksort.c
# Opt level: O0

void quicksort(string *a,size_t n)

{
  string puVar1;
  uchar *s2;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_5c;
  int local_58;
  string pv;
  string t;
  int local_38;
  int s;
  int r;
  int pn;
  int pm;
  int pl;
  int pd;
  int pc;
  int pb;
  int pa;
  size_t n_local;
  string *a_local;
  
  if (n < 10) {
    for (r = 1; (ulong)(long)r < n; r = r + 1) {
      pn = r;
      while( true ) {
        bVar4 = false;
        if (0 < pn) {
          iVar2 = scmp(a[pn + -1],a[pn]);
          bVar4 = 0 < iVar2;
        }
        if (!bVar4) break;
        puVar1 = a[pn];
        a[pn] = a[pn + -1];
        a[pn + -1] = puVar1;
        pn = pn + -1;
      }
    }
  }
  else {
    r = (int)(n >> 1);
    iVar2 = (int)n;
    if (7 < n) {
      pn = 0;
      s = iVar2 + -1;
      if (0x28 < n) {
        iVar3 = (int)(n >> 3);
        pn = med3(0,iVar3,iVar3 * 2,a);
        r = med3(r - iVar3,r,r + iVar3,a);
        s = med3(s + iVar3 * -2,s - iVar3,s,a);
      }
      r = med3(pn,r,s,a);
    }
    s2 = a[r];
    pd = 0;
    pc = 0;
    pl = iVar2 + -1;
    pm = pl;
    while( true ) {
      while( true ) {
        bVar4 = false;
        if (pd <= pl) {
          local_38 = scmp(a[pd],s2);
          bVar4 = local_38 < 1;
        }
        if (!bVar4) break;
        if (local_38 == 0) {
          puVar1 = a[pc];
          a[pc] = a[pd];
          a[pd] = puVar1;
          pc = pc + 1;
        }
        pd = pd + 1;
      }
      while( true ) {
        bVar4 = false;
        if (pd <= pl) {
          local_38 = scmp(a[pl],s2);
          bVar4 = -1 < local_38;
        }
        if (!bVar4) break;
        if (local_38 == 0) {
          puVar1 = a[pl];
          a[pl] = a[pm];
          a[pm] = puVar1;
          pm = pm + -1;
        }
        pl = pl + -1;
      }
      if (pl < pd) break;
      puVar1 = a[pd];
      a[pd] = a[pl];
      a[pl] = puVar1;
      pd = pd + 1;
      pl = pl + -1;
    }
    if (pc < pd - pc) {
      local_58 = pc;
    }
    else {
      local_58 = pd - pc;
    }
    vecswap(0,pd - local_58,local_58,a);
    if (pm - pl < (iVar2 - pm) + -1) {
      local_5c = pm - pl;
    }
    else {
      local_5c = (iVar2 - pm) + -1;
    }
    vecswap(pd,iVar2 - local_5c,local_5c,a);
    if (1 < pd - pc) {
      quicksort(a,(long)(pd - pc));
    }
    iVar3 = pm - pl;
    if (1 < iVar3) {
      quicksort(a + (iVar2 - iVar3),(long)iVar3);
    }
  }
  return;
}

Assistant:

void quicksort(string a[], size_t n)
{
   int pa, pb, pc, pd, pl, pm, pn, r, s;
   string t;
   string pv;

   if (n < 10) {       /* Insertion sort on smallest arrays */
      for (pm = 1; pm < n; pm++)
         for (pl = pm; pl > 0 && scmp(a[pl-1], a[pl]) > 0; pl--)
            swap(a[pl], a[pl-1]);
      return;
   }
   pm = n/2;               /* Small arrays, middle element */
   if (n > 7) {
      pl = 0;
      pn = n-1;
      if (n > 40) {       /* Big arrays, pseudomedian of 9 */
         s = n/8;
         pl = med3(pl, pl+s, pl+2*s, a);
         pm = med3(pm-s, pm, pm+s, a);
         pn = med3(pn-2*s, pn-s, pn, a);
      }
      pm = med3(pl, pm, pn, a);      /* Mid-size, med of 3 */
   }
   pv = a[pm];
   pa = pb = 0;
   pc = pd = n-1;
   for (;;) {
      while (pb <= pc && (r = scmp(a[pb], pv)) <= 0) {
         if (r == 0) { swap(a[pa], a[pb]); pa++; }
         pb++;
      }
      while (pc >= pb && (r = scmp(a[pc], pv)) >= 0) {
         if (r == 0) { swap(a[pc], a[pd]); pd--; }
         pc--;
      }
      if (pb > pc) break;
      swap(a[pb], a[pc]);
      pb++;
      pc--;
   }
   pn = n;
   s = min(pa,  pb-pa   ); vecswap(0,  pb-s, s, a);
   s = min(pd-pc, pn-pd-1); vecswap(pb, pn-s, s, a);
   if ((s = pb-pa) > 1) quicksort(a,    s);
   if ((s = pd-pc) > 1) quicksort(&a[pn-s], s);
}